

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O0

err_t cmdStCrc(octet *crc,char *prefix)

{
  bool_t bVar1;
  blob_t buf_00;
  file_t pFVar2;
  size_t sVar3;
  size_t *in_RSI;
  void *in_RDI;
  file_t file;
  void *state;
  octet *buf;
  char *name;
  void *stack;
  size_t count;
  err_t code;
  size_t buf_size;
  char *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  file_t local_60;
  file_t local_30;
  err_t local_24;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x20);
  if ((bVar1 == 0) ||
     ((in_RSI != (size_t *)0x0 &&
      (bVar1 = strIsValid((char *)in_stack_ffffffffffffff80), bVar1 == 0)))) {
    local_4 = 0x6d;
  }
  else {
    local_4 = cmdSysModulePath(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (local_4 == 0) {
      if (local_30 < (file_t)0x1000) {
        local_60 = (file_t)&DAT_00001000;
      }
      else {
        local_60 = local_30;
      }
      beltHash_keep();
      buf_00 = blobCreate((size_t)in_stack_ffffffffffffff78);
      local_4 = 0x6e;
      if (buf_00 != (blob_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        if (local_30 < (file_t)&DAT_00001000) {
          local_30 = (file_t)&DAT_00001000;
        }
        local_4 = cmdSysModulePath((char *)local_30,in_stack_ffffffffffffff80);
        if (local_4 == 0) {
          pFVar2 = fileOpen((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          local_4 = 0xcb;
          if (pFVar2 != (file_t)0x0) {
            local_4 = 0;
          }
          if (local_4 == 0) {
            beltHashStart(in_stack_ffffffffffffff80);
            local_24 = 0;
            if (in_RSI != (size_t *)0x0) {
              strLen((char *)0x10b587);
              beltHashStepH(buf_00,(size_t)local_30,in_RSI);
              in_stack_ffffffffffffff80 = in_RSI;
            }
            do {
              sVar3 = fileRead2(local_60,(size_t)buf_00,local_30);
              if (sVar3 == 0xffffffffffffffff) {
                local_24 = 0xcf;
              }
              if (local_24 != 0) {
                fileClose((file_t)0x10b5d3);
                blobClose((blob_t)0x10b5dd);
                return local_24;
              }
              beltHashStepH(buf_00,(size_t)local_30,in_stack_ffffffffffffff80);
            } while (sVar3 != 0);
            bVar1 = fileClose((file_t)0x10b610);
            local_4 = 0x67;
            if (bVar1 != 0) {
              local_4 = 0;
            }
            if (local_4 == 0) {
              beltHashStepG((octet *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
              blobClose((blob_t)0x10b65a);
            }
            else {
              blobClose((blob_t)0x10b634);
            }
          }
          else {
            blobClose((blob_t)0x10b551);
          }
        }
        else {
          blobClose((blob_t)0x10b505);
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdStCrc(octet crc[32], const char* prefix)
{
	const size_t buf_size = 4096;
	err_t code;
	size_t count;
	void* stack;
	char* name;
	octet* buf;
	void* state;
	file_t file;
	// входной контроль
	if (!memIsValid(crc, 32) || !strIsNullOrValid(prefix))
		return ERR_BAD_INPUT;
	// определить длину имени исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	// выделить и разметить память	
	code = cmdBlobCreate(stack, MAX2(buf_size, count) + beltHash_keep());
	ERR_CALL_CHECK(code);
	buf = (octet*)stack;
	name = (char*)stack;
	state = buf + MAX2(buf_size, count);
	// определить имя исполняемого модуля
	code = cmdSysModulePath(name, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// открыть исполнямый модуль
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// начать хэширование
	beltHashStart(state);
	if (prefix)
		beltHashStepH(prefix, strLen(prefix), state);
	// хэшировать файл
	do
	{
		if ((count = fileRead2(buf, buf_size, file)) == SIZE_MAX)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		beltHashStepH(buf, count, state);
	} while (count);
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// завершить
	beltHashStepG(crc, state);
	cmdBlobClose(stack);
	return code;
}